

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

string * cmakemainGetStack_abi_cxx11_(string *__return_storage_ptr__,void *clientdata)

{
  cmMakefile *this;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this = cmakemainGetMakefile(clientdata);
  if (this != (cmMakefile *)0x0) {
    cmMakefile::FormatListFileStack_abi_cxx11_(&local_30,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::operator+(&local_30,"\n   Called from: ",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmakemainGetStack(void *clientdata)
{
  std::string msg;
  cmMakefile* mf=cmakemainGetMakefile(clientdata);
  if (mf)
    {
    msg = mf->FormatListFileStack();
    if (!msg.empty())
      {
      msg = "\n   Called from: " + msg;
      }
    }

  return msg;
}